

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O1

void HFilter16i_SSE2(uint8_t *p,int stride,int thresh,int ithresh,int hev_thresh)

{
  long lVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [14];
  unkbyte10 Var22;
  undefined1 auVar23 [14];
  unkbyte10 Var24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined1 auVar28 [12];
  undefined1 auVar29 [14];
  undefined1 auVar30 [14];
  undefined1 auVar31 [12];
  undefined1 auVar32 [14];
  undefined1 auVar33 [14];
  undefined1 auVar34 [12];
  undefined1 auVar35 [14];
  undefined1 auVar36 [12];
  undefined1 auVar37 [14];
  undefined1 auVar38 [12];
  long lVar39;
  undefined1 auVar40 [16];
  long lVar41;
  uint uVar42;
  uint8_t *puVar43;
  int iVar44;
  uint8_t *puVar45;
  __m128i it;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  __m128i t2;
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined4 uVar73;
  undefined1 auVar75 [12];
  __m128i m_thresh;
  undefined1 auVar76 [16];
  undefined1 auVar86 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  __m128i h;
  undefined1 auVar98 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  char cVar105;
  undefined2 uVar106;
  char cVar125;
  char cVar126;
  char cVar127;
  undefined2 uVar128;
  char cVar130;
  undefined2 uVar131;
  char cVar133;
  undefined2 uVar134;
  char cVar136;
  undefined2 uVar137;
  char cVar139;
  undefined2 uVar140;
  char cVar142;
  __m128i t_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  char cVar124;
  char cVar129;
  char cVar132;
  char cVar135;
  char cVar138;
  char cVar141;
  char cVar144;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined2 uVar143;
  undefined1 auVar145 [12];
  undefined1 auVar146 [16];
  undefined1 auVar154 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar174 [12];
  byte bVar202;
  byte bVar203;
  byte bVar204;
  byte bVar205;
  byte bVar206;
  byte bVar207;
  byte bVar208;
  byte bVar209;
  byte bVar210;
  byte bVar211;
  byte bVar213;
  byte bVar214;
  byte bVar215;
  undefined1 auVar175 [16];
  undefined1 auVar185 [16];
  undefined1 auVar193 [16];
  byte bVar212;
  byte bVar216;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  byte bVar217;
  byte bVar235;
  byte bVar236;
  byte bVar237;
  byte bVar238;
  byte bVar239;
  byte bVar240;
  byte bVar241;
  byte bVar242;
  byte bVar243;
  byte bVar244;
  byte bVar245;
  byte bVar246;
  byte bVar247;
  byte bVar248;
  undefined1 auVar218 [16];
  undefined1 auVar222 [16];
  byte bVar249;
  undefined1 auVar223 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  undefined1 auVar250 [16];
  byte bVar251;
  byte bVar255;
  byte bVar256;
  byte bVar257;
  byte bVar258;
  byte bVar259;
  byte bVar260;
  byte bVar261;
  byte bVar262;
  byte bVar263;
  byte bVar264;
  byte bVar265;
  byte bVar266;
  byte bVar267;
  byte bVar268;
  undefined1 auVar252 [16];
  byte bVar269;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  byte bVar270;
  byte bVar274;
  byte bVar275;
  byte bVar276;
  byte bVar277;
  byte bVar278;
  byte bVar279;
  byte bVar280;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined2 uVar283;
  undefined1 auVar290 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 uVar58;
  undefined1 uVar59;
  undefined1 uVar60;
  undefined1 auVar62 [16];
  undefined1 auVar68 [16];
  undefined1 auVar63 [16];
  undefined1 auVar69 [16];
  undefined1 auVar64 [16];
  undefined1 auVar70 [16];
  undefined1 auVar77 [16];
  undefined1 auVar87 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar74 [12];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar85 [16];
  undefined1 auVar95 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined6 uVar107;
  undefined1 auVar114 [16];
  undefined8 uVar108;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar109 [12];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar110 [14];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar123 [16];
  undefined1 auVar155 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar163 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar184 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar219 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar220 [16];
  undefined1 auVar226 [16];
  undefined1 auVar232 [16];
  undefined1 auVar227 [16];
  undefined1 auVar221 [16];
  undefined1 auVar228 [16];
  undefined1 auVar233 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined4 uVar284;
  undefined6 uVar285;
  undefined8 uVar286;
  undefined1 auVar287 [12];
  undefined1 auVar288 [14];
  undefined1 auVar289 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  
  auVar40 = _DAT_001b77a0;
  lVar41 = (long)stride;
  lVar1 = lVar41 * 8;
  lVar19 = lVar41 * 6;
  lVar2 = lVar41 * 4;
  uVar73 = *(undefined4 *)(p + lVar41 * 2);
  uVar284 = *(undefined4 *)(p + lVar19);
  auVar273._0_8_ = CONCAT44(uVar284,uVar73);
  uVar3 = *(undefined4 *)(p + lVar41 * 4);
  uVar4 = *(undefined4 *)p;
  auVar78._0_8_ = CONCAT44(uVar3,uVar4);
  lVar20 = lVar41 * 7;
  lVar17 = lVar41 * 3;
  lVar18 = lVar41 * 5;
  uVar5 = *(undefined4 *)(p + lVar17);
  uVar6 = *(undefined4 *)(p + lVar20);
  auVar57._8_6_ = 0;
  auVar57._0_8_ = auVar273._0_8_;
  auVar57[0xe] = (char)((uint)uVar284 >> 0x18);
  auVar57[0xf] = (char)((uint)uVar6 >> 0x18);
  auVar97._14_2_ = auVar57._14_2_;
  auVar97._8_5_ = 0;
  auVar97._0_8_ = auVar273._0_8_;
  auVar97[0xd] = (char)((uint)uVar6 >> 0x10);
  auVar104._13_3_ = auVar97._13_3_;
  auVar104._8_4_ = 0;
  auVar104._0_8_ = auVar273._0_8_;
  auVar104[0xc] = (char)((uint)uVar284 >> 0x10);
  auVar66._12_4_ = auVar104._12_4_;
  auVar66._8_3_ = 0;
  auVar66._0_8_ = auVar273._0_8_;
  auVar66[0xb] = (char)((uint)uVar6 >> 8);
  auVar111._11_5_ = auVar66._11_5_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = auVar273._0_8_;
  auVar111[10] = (char)((uint)uVar284 >> 8);
  auVar252._10_6_ = auVar111._10_6_;
  auVar252[8] = 0;
  auVar252._0_8_ = auVar273._0_8_;
  auVar252[9] = (char)uVar6;
  auVar273._9_7_ = auVar252._9_7_;
  auVar273[8] = (char)uVar284;
  Var22 = CONCAT91(CONCAT81(auVar273._8_8_,(char)((uint)uVar5 >> 0x18)),(char)((uint)uVar73 >> 0x18)
                  );
  auVar46._6_10_ = Var22;
  auVar46[5] = (char)((uint)uVar5 >> 0x10);
  auVar46[4] = (char)((uint)uVar73 >> 0x10);
  auVar46._0_4_ = uVar73;
  auVar21._2_12_ = auVar46._4_12_;
  auVar21[1] = (char)((uint)uVar5 >> 8);
  auVar21[0] = (char)((uint)uVar73 >> 8);
  uVar284 = *(undefined4 *)(p + lVar41);
  uVar6 = *(undefined4 *)(p + lVar18);
  auVar84._8_6_ = 0;
  auVar84._0_8_ = auVar78._0_8_;
  auVar84[0xe] = (char)((uint)uVar3 >> 0x18);
  auVar84[0xf] = (char)((uint)uVar6 >> 0x18);
  auVar83._14_2_ = auVar84._14_2_;
  auVar83._8_5_ = 0;
  auVar83._0_8_ = auVar78._0_8_;
  auVar83[0xd] = (char)((uint)uVar6 >> 0x10);
  auVar82._13_3_ = auVar83._13_3_;
  auVar82._8_4_ = 0;
  auVar82._0_8_ = auVar78._0_8_;
  auVar82[0xc] = (char)((uint)uVar3 >> 0x10);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_3_ = 0;
  auVar81._0_8_ = auVar78._0_8_;
  auVar81[0xb] = (char)((uint)uVar6 >> 8);
  auVar80._11_5_ = auVar81._11_5_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = auVar78._0_8_;
  auVar80[10] = (char)((uint)uVar3 >> 8);
  auVar79._10_6_ = auVar80._10_6_;
  auVar79[8] = 0;
  auVar79._0_8_ = auVar78._0_8_;
  auVar79[9] = (char)uVar6;
  auVar78._9_7_ = auVar79._9_7_;
  auVar78[8] = (char)uVar3;
  Var24 = CONCAT91(CONCAT81(auVar78._8_8_,(char)((uint)uVar284 >> 0x18)),(char)((uint)uVar4 >> 0x18)
                  );
  auVar77._6_10_ = Var24;
  auVar77[5] = (char)((uint)uVar284 >> 0x10);
  auVar77[4] = (char)((uint)uVar4 >> 0x10);
  auVar77._0_4_ = uVar4;
  auVar23._2_12_ = auVar77._4_12_;
  auVar23[1] = (char)((uint)uVar284 >> 8);
  auVar23[0] = (char)((uint)uVar4 >> 8);
  auVar76._0_2_ = CONCAT11((char)uVar284,(char)uVar4);
  auVar76._2_14_ = auVar23;
  auVar64._0_12_ = auVar76._0_12_;
  auVar64._12_2_ = (short)Var24;
  auVar64._14_2_ = (short)Var22;
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._0_10_ = auVar76._0_10_;
  auVar63._10_2_ = auVar46._4_2_;
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._0_8_ = auVar76._0_8_;
  auVar62._8_2_ = auVar77._4_2_;
  auVar25._4_8_ = auVar62._8_8_;
  auVar25._2_2_ = auVar21._0_2_;
  auVar25._0_2_ = auVar23._0_2_;
  auVar61._0_4_ = CONCAT22(CONCAT11((char)uVar5,(char)uVar73),auVar76._0_2_);
  auVar61._4_12_ = auVar25;
  uVar73 = CONCAT22(auVar273._8_2_,auVar78._8_2_);
  auVar74._0_8_ = CONCAT26(auVar111._10_2_,CONCAT24(auVar80._10_2_,uVar73));
  auVar74._8_2_ = auVar82._12_2_;
  auVar74._10_2_ = auVar104._12_2_;
  auVar85._12_2_ = auVar83._14_2_;
  auVar85._0_12_ = auVar74;
  auVar85._14_2_ = auVar97._14_2_;
  auVar271._0_8_ = auVar61._0_8_;
  auVar271._8_4_ = auVar25._0_4_;
  auVar271._12_4_ = (int)((ulong)auVar74._0_8_ >> 0x20);
  auVar254._4_4_ = uVar73;
  auVar254._0_4_ = auVar61._0_4_;
  auVar65._0_8_ = CONCAT44(auVar74._8_4_,auVar62._8_4_);
  auVar65._8_4_ = auVar63._12_4_;
  auVar65._12_4_ = auVar85._12_4_;
  uVar73 = *(undefined4 *)(p + lVar41 * 10);
  uVar284 = *(undefined4 *)(p + lVar41 * 0xe);
  auVar48._0_8_ = CONCAT44(uVar284,uVar73);
  uVar3 = *(undefined4 *)(p + lVar41 * 8);
  uVar4 = *(undefined4 *)(p + lVar41 * 0xc);
  auVar88._0_8_ = CONCAT44(uVar4,uVar3);
  uVar5 = *(undefined4 *)(p + lVar41 * 0xf);
  uVar6 = *(undefined4 *)(p + lVar41 * 0xb);
  auVar54._8_6_ = 0;
  auVar54._0_8_ = auVar48._0_8_;
  auVar54[0xe] = (char)((uint)uVar284 >> 0x18);
  auVar54[0xf] = (char)((uint)uVar5 >> 0x18);
  auVar53._14_2_ = auVar54._14_2_;
  auVar53._8_5_ = 0;
  auVar53._0_8_ = auVar48._0_8_;
  auVar53[0xd] = (char)((uint)uVar5 >> 0x10);
  auVar52._13_3_ = auVar53._13_3_;
  auVar52._8_4_ = 0;
  auVar52._0_8_ = auVar48._0_8_;
  auVar52[0xc] = (char)((uint)uVar284 >> 0x10);
  auVar51._12_4_ = auVar52._12_4_;
  auVar51._8_3_ = 0;
  auVar51._0_8_ = auVar48._0_8_;
  auVar51[0xb] = (char)((uint)uVar5 >> 8);
  auVar50._11_5_ = auVar51._11_5_;
  auVar50._8_2_ = 0;
  auVar50._0_8_ = auVar48._0_8_;
  auVar50[10] = (char)((uint)uVar284 >> 8);
  auVar49._10_6_ = auVar50._10_6_;
  auVar49[8] = 0;
  auVar49._0_8_ = auVar48._0_8_;
  auVar49[9] = (char)uVar5;
  auVar48._9_7_ = auVar49._9_7_;
  auVar48[8] = (char)uVar284;
  Var22 = CONCAT91(CONCAT81(auVar48._8_8_,(char)((uint)uVar6 >> 0x18)),(char)((uint)uVar73 >> 0x18))
  ;
  auVar47._6_10_ = Var22;
  auVar47[5] = (char)((uint)uVar6 >> 0x10);
  auVar47[4] = (char)((uint)uVar73 >> 0x10);
  auVar47._0_4_ = uVar73;
  auVar26._2_12_ = auVar47._4_12_;
  auVar26[1] = (char)((uint)uVar6 >> 8);
  auVar26[0] = (char)((uint)uVar73 >> 8);
  uVar284 = *(undefined4 *)(p + lVar41 * 0xd);
  uVar5 = *(undefined4 *)(p + lVar41 * 9);
  auVar94._8_6_ = 0;
  auVar94._0_8_ = auVar88._0_8_;
  auVar94[0xe] = (char)((uint)uVar4 >> 0x18);
  auVar94[0xf] = (char)((uint)uVar284 >> 0x18);
  auVar93._14_2_ = auVar94._14_2_;
  auVar93._8_5_ = 0;
  auVar93._0_8_ = auVar88._0_8_;
  auVar93[0xd] = (char)((uint)uVar284 >> 0x10);
  auVar92._13_3_ = auVar93._13_3_;
  auVar92._8_4_ = 0;
  auVar92._0_8_ = auVar88._0_8_;
  auVar92[0xc] = (char)((uint)uVar4 >> 0x10);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_3_ = 0;
  auVar91._0_8_ = auVar88._0_8_;
  auVar91[0xb] = (char)((uint)uVar284 >> 8);
  auVar90._11_5_ = auVar91._11_5_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = auVar88._0_8_;
  auVar90[10] = (char)((uint)uVar4 >> 8);
  auVar89._10_6_ = auVar90._10_6_;
  auVar89[8] = 0;
  auVar89._0_8_ = auVar88._0_8_;
  auVar89[9] = (char)uVar284;
  auVar88._9_7_ = auVar89._9_7_;
  auVar88[8] = (char)uVar4;
  Var24 = CONCAT91(CONCAT81(auVar88._8_8_,(char)((uint)uVar5 >> 0x18)),(char)((uint)uVar3 >> 0x18));
  auVar87._6_10_ = Var24;
  auVar87[5] = (char)((uint)uVar5 >> 0x10);
  auVar87[4] = (char)((uint)uVar3 >> 0x10);
  auVar87._0_4_ = uVar3;
  auVar27._2_12_ = auVar87._4_12_;
  auVar27[1] = (char)((uint)uVar5 >> 8);
  auVar27[0] = (char)((uint)uVar3 >> 8);
  auVar86._0_2_ = CONCAT11((char)uVar5,(char)uVar3);
  auVar86._2_14_ = auVar27;
  auVar101._0_12_ = auVar86._0_12_;
  auVar101._12_2_ = (short)Var24;
  auVar101._14_2_ = (short)Var22;
  auVar100._12_4_ = auVar101._12_4_;
  auVar100._0_10_ = auVar86._0_10_;
  auVar100._10_2_ = auVar47._4_2_;
  auVar99._10_6_ = auVar100._10_6_;
  auVar99._0_8_ = auVar86._0_8_;
  auVar99._8_2_ = auVar87._4_2_;
  auVar28._4_8_ = auVar99._8_8_;
  auVar28._2_2_ = auVar26._0_2_;
  auVar28._0_2_ = auVar27._0_2_;
  auVar98._0_4_ = CONCAT22(CONCAT11((char)uVar6,(char)uVar73),auVar86._0_2_);
  auVar98._4_12_ = auVar28;
  uVar73 = CONCAT22(auVar48._8_2_,auVar88._8_2_);
  auVar75._0_8_ = CONCAT26(auVar50._10_2_,CONCAT24(auVar90._10_2_,uVar73));
  auVar75._8_2_ = auVar92._12_2_;
  auVar75._10_2_ = auVar52._12_2_;
  auVar95._12_2_ = auVar93._14_2_;
  auVar95._0_12_ = auVar75;
  auVar95._14_2_ = auVar53._14_2_;
  auVar55._0_8_ = auVar98._0_8_;
  auVar55._8_4_ = auVar28._0_4_;
  auVar55._12_4_ = (int)((ulong)auVar75._0_8_ >> 0x20);
  auVar254._12_4_ = uVar73;
  auVar254._8_4_ = auVar98._0_4_;
  auVar102._0_8_ = CONCAT44(auVar75._8_4_,auVar99._8_4_);
  auVar102._8_4_ = auVar100._12_4_;
  auVar102._12_4_ = auVar95._12_4_;
  auVar298._8_8_ = auVar55._8_8_;
  auVar298._0_8_ = auVar271._8_8_;
  auVar281._8_8_ = auVar102._0_8_;
  auVar281._0_8_ = auVar65._0_8_;
  auVar122._8_8_ = auVar102._8_8_;
  auVar122._0_8_ = auVar65._8_8_;
  uVar60 = (undefined1)((uint)ithresh >> 0x18);
  uVar59 = (undefined1)((uint)ithresh >> 0x10);
  uVar58 = (undefined1)((uint)ithresh >> 8);
  auVar56._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar60,uVar60),uVar59),CONCAT14(uVar59,ithresh)) >> 0x20);
  auVar56[3] = uVar58;
  auVar56[2] = uVar58;
  auVar56[0] = (undefined1)ithresh;
  auVar56[1] = auVar56[0];
  auVar56._8_8_ = 0;
  auVar57 = pshuflw(auVar56,auVar56,0);
  uVar60 = (undefined1)((uint)thresh >> 0x18);
  uVar59 = (undefined1)((uint)thresh >> 0x10);
  uVar58 = (undefined1)((uint)thresh >> 8);
  auVar96._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar60,uVar60),uVar59),CONCAT14(uVar59,thresh)) >> 0x20);
  auVar96[3] = uVar58;
  auVar96[2] = uVar58;
  auVar96[0] = (undefined1)thresh;
  auVar96[1] = auVar96[0];
  auVar96._8_8_ = 0;
  auVar97 = pshuflw(auVar96,auVar96,0);
  uVar60 = (undefined1)((uint)hev_thresh >> 0x18);
  uVar59 = (undefined1)((uint)hev_thresh >> 0x10);
  uVar58 = (undefined1)((uint)hev_thresh >> 8);
  auVar103._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar60,uVar60),uVar59),CONCAT14(uVar59,hev_thresh)) >> 0x20)
  ;
  auVar103[3] = uVar58;
  auVar103[2] = uVar58;
  auVar103[0] = (undefined1)hev_thresh;
  auVar103[1] = auVar103[0];
  auVar103._8_8_ = 0;
  auVar104 = pshuflw(auVar103,auVar103,0);
  uVar42 = 3;
  do {
    auVar66 = psubusb(auVar122,auVar281);
    auVar111 = psubusb(auVar281,auVar122);
    auVar111 = auVar111 | auVar66;
    auVar66 = psubusb(auVar298,auVar254);
    auVar252 = psubusb(auVar254,auVar298);
    auVar252 = auVar252 | auVar66;
    bVar8 = auVar111[0];
    bVar251 = auVar252[0];
    bVar251 = (bVar251 < bVar8) * bVar8 | (bVar251 >= bVar8) * bVar251;
    bVar9 = auVar111[1];
    bVar255 = auVar252[1];
    bVar255 = (bVar255 < bVar9) * bVar9 | (bVar255 >= bVar9) * bVar255;
    bVar274 = auVar111[2];
    bVar256 = auVar252[2];
    bVar256 = (bVar256 < bVar274) * bVar274 | (bVar256 >= bVar274) * bVar256;
    bVar275 = auVar111[3];
    bVar257 = auVar252[3];
    bVar257 = (bVar257 < bVar275) * bVar275 | (bVar257 >= bVar275) * bVar257;
    bVar276 = auVar111[4];
    bVar258 = auVar252[4];
    bVar258 = (bVar258 < bVar276) * bVar276 | (bVar258 >= bVar276) * bVar258;
    bVar277 = auVar111[5];
    bVar259 = auVar252[5];
    bVar259 = (bVar259 < bVar277) * bVar277 | (bVar259 >= bVar277) * bVar259;
    bVar278 = auVar111[6];
    bVar260 = auVar252[6];
    bVar260 = (bVar260 < bVar278) * bVar278 | (bVar260 >= bVar278) * bVar260;
    bVar279 = auVar111[7];
    bVar261 = auVar252[7];
    bVar261 = (bVar261 < bVar279) * bVar279 | (bVar261 >= bVar279) * bVar261;
    bVar280 = auVar111[8];
    bVar262 = auVar252[8];
    bVar262 = (bVar262 < bVar280) * bVar280 | (bVar262 >= bVar280) * bVar262;
    bVar10 = auVar111[9];
    bVar263 = auVar252[9];
    bVar263 = (bVar263 < bVar10) * bVar10 | (bVar263 >= bVar10) * bVar263;
    bVar11 = auVar111[10];
    bVar264 = auVar252[10];
    bVar264 = (bVar264 < bVar11) * bVar11 | (bVar264 >= bVar11) * bVar264;
    bVar12 = auVar111[0xb];
    bVar265 = auVar252[0xb];
    bVar265 = (bVar265 < bVar12) * bVar12 | (bVar265 >= bVar12) * bVar265;
    bVar13 = auVar111[0xc];
    bVar266 = auVar252[0xc];
    bVar266 = (bVar266 < bVar13) * bVar13 | (bVar266 >= bVar13) * bVar266;
    bVar14 = auVar111[0xd];
    bVar267 = auVar252[0xd];
    bVar267 = (bVar267 < bVar14) * bVar14 | (bVar267 >= bVar14) * bVar267;
    bVar15 = auVar111[0xe];
    bVar268 = auVar252[0xe];
    bVar269 = auVar252[0xf];
    bVar268 = (bVar268 < bVar15) * bVar15 | (bVar268 >= bVar15) * bVar268;
    bVar16 = auVar111[0xf];
    bVar269 = (bVar269 < bVar16) * bVar16 | (bVar269 >= bVar16) * bVar269;
    auVar66 = psubusb(auVar281,auVar298);
    auVar111 = psubusb(auVar298,auVar281);
    auVar111 = auVar111 | auVar66;
    bVar270 = auVar111[0];
    bVar270 = (bVar270 < bVar251) * bVar251 | (bVar270 >= bVar251) * bVar270;
    bVar251 = auVar111[1];
    bVar255 = (bVar251 < bVar255) * bVar255 | (bVar251 >= bVar255) * bVar251;
    bVar251 = auVar111[2];
    bVar256 = (bVar251 < bVar256) * bVar256 | (bVar251 >= bVar256) * bVar251;
    bVar251 = auVar111[3];
    bVar257 = (bVar251 < bVar257) * bVar257 | (bVar251 >= bVar257) * bVar251;
    bVar251 = auVar111[4];
    bVar258 = (bVar251 < bVar258) * bVar258 | (bVar251 >= bVar258) * bVar251;
    bVar251 = auVar111[5];
    bVar259 = (bVar251 < bVar259) * bVar259 | (bVar251 >= bVar259) * bVar251;
    bVar251 = auVar111[6];
    bVar260 = (bVar251 < bVar260) * bVar260 | (bVar251 >= bVar260) * bVar251;
    bVar251 = auVar111[7];
    bVar261 = (bVar251 < bVar261) * bVar261 | (bVar251 >= bVar261) * bVar251;
    bVar251 = auVar111[8];
    bVar262 = (bVar251 < bVar262) * bVar262 | (bVar251 >= bVar262) * bVar251;
    bVar251 = auVar111[9];
    bVar263 = (bVar251 < bVar263) * bVar263 | (bVar251 >= bVar263) * bVar251;
    bVar251 = auVar111[10];
    bVar264 = (bVar251 < bVar264) * bVar264 | (bVar251 >= bVar264) * bVar251;
    bVar251 = auVar111[0xb];
    bVar265 = (bVar251 < bVar265) * bVar265 | (bVar251 >= bVar265) * bVar251;
    bVar251 = auVar111[0xc];
    bVar266 = (bVar251 < bVar266) * bVar266 | (bVar251 >= bVar266) * bVar251;
    bVar251 = auVar111[0xd];
    bVar267 = (bVar251 < bVar267) * bVar267 | (bVar251 >= bVar267) * bVar251;
    bVar251 = auVar111[0xe];
    bVar202 = auVar111[0xf];
    bVar268 = (bVar251 < bVar268) * bVar268 | (bVar251 >= bVar268) * bVar251;
    bVar269 = (bVar202 < bVar269) * bVar269 | (bVar202 >= bVar269) * bVar202;
    lVar39 = lVar1 + 4;
    uVar73 = *(undefined4 *)(p + lVar19 + 4);
    uVar284 = *(undefined4 *)(p + lVar41 * 2 + 4);
    auVar147._0_8_ = CONCAT44(uVar73,uVar284);
    uVar3 = *(undefined4 *)(p + lVar2 + 4);
    uVar4 = *(undefined4 *)(p + 4);
    auVar177._0_8_ = CONCAT44(uVar3,uVar4);
    uVar5 = *(undefined4 *)(p + lVar20 + 4);
    uVar6 = *(undefined4 *)(p + lVar17 + 4);
    auVar153._8_6_ = 0;
    auVar153._0_8_ = auVar147._0_8_;
    auVar153[0xe] = (char)((uint)uVar73 >> 0x18);
    auVar153[0xf] = (char)((uint)uVar5 >> 0x18);
    auVar152._14_2_ = auVar153._14_2_;
    auVar152._8_5_ = 0;
    auVar152._0_8_ = auVar147._0_8_;
    auVar152[0xd] = (char)((uint)uVar5 >> 0x10);
    auVar151._13_3_ = auVar152._13_3_;
    auVar151._8_4_ = 0;
    auVar151._0_8_ = auVar147._0_8_;
    auVar151[0xc] = (char)((uint)uVar73 >> 0x10);
    auVar150._12_4_ = auVar151._12_4_;
    auVar150._8_3_ = 0;
    auVar150._0_8_ = auVar147._0_8_;
    auVar150[0xb] = (char)((uint)uVar5 >> 8);
    auVar149._11_5_ = auVar150._11_5_;
    auVar149._8_2_ = 0;
    auVar149._0_8_ = auVar147._0_8_;
    auVar149[10] = (char)((uint)uVar73 >> 8);
    auVar148._10_6_ = auVar149._10_6_;
    auVar148[8] = 0;
    auVar148._0_8_ = auVar147._0_8_;
    auVar148[9] = (char)uVar5;
    auVar147._9_7_ = auVar148._9_7_;
    auVar147[8] = (char)uVar73;
    Var22 = CONCAT91(CONCAT81(auVar147._8_8_,(char)((uint)uVar6 >> 0x18)),
                     (char)((uint)uVar284 >> 0x18));
    auVar146._6_10_ = Var22;
    auVar146[5] = (char)((uint)uVar6 >> 0x10);
    auVar146[4] = (char)((uint)uVar284 >> 0x10);
    auVar146._0_4_ = uVar284;
    auVar29._2_12_ = auVar146._4_12_;
    auVar29[1] = (char)((uint)uVar6 >> 8);
    auVar29[0] = (char)((uint)uVar284 >> 8);
    uVar73 = *(undefined4 *)(p + lVar18 + 4);
    uVar5 = *(undefined4 *)(p + lVar41 + 4);
    auVar183._8_6_ = 0;
    auVar183._0_8_ = auVar177._0_8_;
    auVar183[0xe] = (char)((uint)uVar3 >> 0x18);
    auVar183[0xf] = (char)((uint)uVar73 >> 0x18);
    auVar182._14_2_ = auVar183._14_2_;
    auVar182._8_5_ = 0;
    auVar182._0_8_ = auVar177._0_8_;
    auVar182[0xd] = (char)((uint)uVar73 >> 0x10);
    auVar181._13_3_ = auVar182._13_3_;
    auVar181._8_4_ = 0;
    auVar181._0_8_ = auVar177._0_8_;
    auVar181[0xc] = (char)((uint)uVar3 >> 0x10);
    auVar180._12_4_ = auVar181._12_4_;
    auVar180._8_3_ = 0;
    auVar180._0_8_ = auVar177._0_8_;
    auVar180[0xb] = (char)((uint)uVar73 >> 8);
    auVar179._11_5_ = auVar180._11_5_;
    auVar179._8_2_ = 0;
    auVar179._0_8_ = auVar177._0_8_;
    auVar179[10] = (char)((uint)uVar3 >> 8);
    auVar178._10_6_ = auVar179._10_6_;
    auVar178[8] = 0;
    auVar178._0_8_ = auVar177._0_8_;
    auVar178[9] = (char)uVar73;
    auVar177._9_7_ = auVar178._9_7_;
    auVar177[8] = (char)uVar3;
    Var24 = CONCAT91(CONCAT81(auVar177._8_8_,(char)((uint)uVar5 >> 0x18)),
                     (char)((uint)uVar4 >> 0x18));
    auVar176._6_10_ = Var24;
    auVar176[5] = (char)((uint)uVar5 >> 0x10);
    auVar176[4] = (char)((uint)uVar4 >> 0x10);
    auVar176._0_4_ = uVar4;
    auVar30._2_12_ = auVar176._4_12_;
    auVar30[1] = (char)((uint)uVar5 >> 8);
    auVar30[0] = (char)((uint)uVar4 >> 8);
    auVar175._0_2_ = CONCAT11((char)uVar5,(char)uVar4);
    auVar175._2_14_ = auVar30;
    auVar70._0_12_ = auVar175._0_12_;
    auVar70._12_2_ = (short)Var24;
    auVar70._14_2_ = (short)Var22;
    auVar69._12_4_ = auVar70._12_4_;
    auVar69._0_10_ = auVar175._0_10_;
    auVar69._10_2_ = auVar146._4_2_;
    auVar68._10_6_ = auVar69._10_6_;
    auVar68._0_8_ = auVar175._0_8_;
    auVar68._8_2_ = auVar176._4_2_;
    auVar31._4_8_ = auVar68._8_8_;
    auVar31._2_2_ = auVar29._0_2_;
    auVar31._0_2_ = auVar30._0_2_;
    auVar67._0_4_ = CONCAT22(CONCAT11((char)uVar6,(char)uVar284),auVar175._0_2_);
    auVar67._4_12_ = auVar31;
    uVar73 = CONCAT22(auVar147._8_2_,auVar177._8_2_);
    auVar174._0_8_ = CONCAT26(auVar149._10_2_,CONCAT24(auVar179._10_2_,uVar73));
    auVar174._8_2_ = auVar181._12_2_;
    auVar174._10_2_ = auVar151._12_2_;
    auVar184._12_2_ = auVar182._14_2_;
    auVar184._0_12_ = auVar174;
    auVar184._14_2_ = auVar152._14_2_;
    auVar296._0_8_ = auVar67._0_8_;
    auVar296._8_4_ = auVar31._0_4_;
    auVar296._12_4_ = (int)((ulong)auVar174._0_8_ >> 0x20);
    auVar253._4_4_ = uVar73;
    auVar253._0_4_ = auVar67._0_4_;
    auVar71._0_8_ = CONCAT44(auVar174._8_4_,auVar68._8_4_);
    auVar71._8_4_ = auVar69._12_4_;
    auVar71._12_4_ = auVar184._12_4_;
    uVar73 = *(undefined4 *)(p + lVar19 + lVar39);
    uVar284 = *(undefined4 *)(p + lVar41 * 2 + lVar39);
    auVar186._0_8_ = CONCAT44(uVar73,uVar284);
    uVar3 = *(undefined4 *)(p + lVar1 + 4);
    uVar4 = *(undefined4 *)(p + lVar2 + lVar39);
    auVar156._0_8_ = CONCAT44(uVar4,uVar3);
    uVar5 = *(undefined4 *)(p + lVar20 + lVar39);
    uVar6 = *(undefined4 *)(p + lVar17 + lVar39);
    auVar192._8_6_ = 0;
    auVar192._0_8_ = auVar186._0_8_;
    auVar192[0xe] = (char)((uint)uVar73 >> 0x18);
    auVar192[0xf] = (char)((uint)uVar5 >> 0x18);
    auVar191._14_2_ = auVar192._14_2_;
    auVar191._8_5_ = 0;
    auVar191._0_8_ = auVar186._0_8_;
    auVar191[0xd] = (char)((uint)uVar5 >> 0x10);
    auVar190._13_3_ = auVar191._13_3_;
    auVar190._8_4_ = 0;
    auVar190._0_8_ = auVar186._0_8_;
    auVar190[0xc] = (char)((uint)uVar73 >> 0x10);
    auVar189._12_4_ = auVar190._12_4_;
    auVar189._8_3_ = 0;
    auVar189._0_8_ = auVar186._0_8_;
    auVar189[0xb] = (char)((uint)uVar5 >> 8);
    auVar188._11_5_ = auVar189._11_5_;
    auVar188._8_2_ = 0;
    auVar188._0_8_ = auVar186._0_8_;
    auVar188[10] = (char)((uint)uVar73 >> 8);
    auVar187._10_6_ = auVar188._10_6_;
    auVar187[8] = 0;
    auVar187._0_8_ = auVar186._0_8_;
    auVar187[9] = (char)uVar5;
    auVar186._9_7_ = auVar187._9_7_;
    auVar186[8] = (char)uVar73;
    Var22 = CONCAT91(CONCAT81(auVar186._8_8_,(char)((uint)uVar6 >> 0x18)),
                     (char)((uint)uVar284 >> 0x18));
    auVar185._6_10_ = Var22;
    auVar185[5] = (char)((uint)uVar6 >> 0x10);
    auVar185[4] = (char)((uint)uVar284 >> 0x10);
    auVar185._0_4_ = uVar284;
    auVar32._2_12_ = auVar185._4_12_;
    auVar32[1] = (char)((uint)uVar6 >> 8);
    auVar32[0] = (char)((uint)uVar284 >> 8);
    uVar73 = *(undefined4 *)(p + lVar18 + lVar39);
    uVar5 = *(undefined4 *)(p + lVar41 + lVar39);
    auVar162._8_6_ = 0;
    auVar162._0_8_ = auVar156._0_8_;
    auVar162[0xe] = (char)((uint)uVar4 >> 0x18);
    auVar162[0xf] = (char)((uint)uVar73 >> 0x18);
    auVar161._14_2_ = auVar162._14_2_;
    auVar161._8_5_ = 0;
    auVar161._0_8_ = auVar156._0_8_;
    auVar161[0xd] = (char)((uint)uVar73 >> 0x10);
    auVar160._13_3_ = auVar161._13_3_;
    auVar160._8_4_ = 0;
    auVar160._0_8_ = auVar156._0_8_;
    auVar160[0xc] = (char)((uint)uVar4 >> 0x10);
    auVar159._12_4_ = auVar160._12_4_;
    auVar159._8_3_ = 0;
    auVar159._0_8_ = auVar156._0_8_;
    auVar159[0xb] = (char)((uint)uVar73 >> 8);
    auVar158._11_5_ = auVar159._11_5_;
    auVar158._8_2_ = 0;
    auVar158._0_8_ = auVar156._0_8_;
    auVar158[10] = (char)((uint)uVar4 >> 8);
    auVar157._10_6_ = auVar158._10_6_;
    auVar157[8] = 0;
    auVar157._0_8_ = auVar156._0_8_;
    auVar157[9] = (char)uVar73;
    auVar156._9_7_ = auVar157._9_7_;
    auVar156[8] = (char)uVar4;
    Var24 = CONCAT91(CONCAT81(auVar156._8_8_,(char)((uint)uVar5 >> 0x18)),
                     (char)((uint)uVar3 >> 0x18));
    auVar155._6_10_ = Var24;
    auVar155[5] = (char)((uint)uVar5 >> 0x10);
    auVar155[4] = (char)((uint)uVar3 >> 0x10);
    auVar155._0_4_ = uVar3;
    auVar33._2_12_ = auVar155._4_12_;
    auVar33[1] = (char)((uint)uVar5 >> 8);
    auVar33[0] = (char)((uint)uVar3 >> 8);
    auVar154._0_2_ = CONCAT11((char)uVar5,(char)uVar3);
    auVar154._2_14_ = auVar33;
    auVar221._0_12_ = auVar154._0_12_;
    auVar221._12_2_ = (short)Var24;
    auVar221._14_2_ = (short)Var22;
    auVar220._12_4_ = auVar221._12_4_;
    auVar220._0_10_ = auVar154._0_10_;
    auVar220._10_2_ = auVar185._4_2_;
    auVar219._10_6_ = auVar220._10_6_;
    auVar219._0_8_ = auVar154._0_8_;
    auVar219._8_2_ = auVar155._4_2_;
    auVar34._4_8_ = auVar219._8_8_;
    auVar34._2_2_ = auVar32._0_2_;
    auVar34._0_2_ = auVar33._0_2_;
    auVar218._0_4_ = CONCAT22(CONCAT11((char)uVar6,(char)uVar284),auVar154._0_2_);
    auVar218._4_12_ = auVar34;
    uVar73 = CONCAT22(auVar186._8_2_,auVar156._8_2_);
    auVar145._0_8_ = CONCAT26(auVar188._10_2_,CONCAT24(auVar158._10_2_,uVar73));
    auVar145._8_2_ = auVar160._12_2_;
    auVar145._10_2_ = auVar190._12_2_;
    auVar163._12_2_ = auVar161._14_2_;
    auVar163._0_12_ = auVar145;
    auVar163._14_2_ = auVar191._14_2_;
    auVar193._0_8_ = auVar218._0_8_;
    auVar193._8_4_ = auVar34._0_4_;
    auVar193._12_4_ = (int)((ulong)auVar145._0_8_ >> 0x20);
    auVar253._12_4_ = uVar73;
    auVar253._8_4_ = auVar218._0_4_;
    auVar222._0_8_ = CONCAT44(auVar145._8_4_,auVar219._8_4_);
    auVar222._8_4_ = auVar220._12_4_;
    auVar222._12_4_ = auVar163._12_4_;
    auVar297._8_8_ = auVar193._8_8_;
    auVar297._0_8_ = auVar296._8_8_;
    auVar282._8_8_ = auVar222._0_8_;
    auVar282._0_8_ = auVar71._0_8_;
    auVar72._8_8_ = auVar222._8_8_;
    auVar72._0_8_ = auVar71._8_8_;
    auVar66 = psubusb(auVar72,auVar282);
    auVar111 = psubusb(auVar282,auVar72);
    auVar111 = auVar111 | auVar66;
    bVar251 = auVar111[0];
    bVar270 = (bVar251 < bVar270) * bVar270 | (bVar251 >= bVar270) * bVar251;
    bVar251 = auVar111[1];
    bVar202 = (bVar251 < bVar255) * bVar255 | (bVar251 >= bVar255) * bVar251;
    bVar251 = auVar111[2];
    bVar203 = (bVar251 < bVar256) * bVar256 | (bVar251 >= bVar256) * bVar251;
    bVar251 = auVar111[3];
    bVar204 = (bVar251 < bVar257) * bVar257 | (bVar251 >= bVar257) * bVar251;
    bVar251 = auVar111[4];
    bVar205 = (bVar251 < bVar258) * bVar258 | (bVar251 >= bVar258) * bVar251;
    bVar251 = auVar111[5];
    bVar206 = (bVar251 < bVar259) * bVar259 | (bVar251 >= bVar259) * bVar251;
    bVar251 = auVar111[6];
    bVar207 = (bVar251 < bVar260) * bVar260 | (bVar251 >= bVar260) * bVar251;
    bVar251 = auVar111[7];
    bVar208 = (bVar251 < bVar261) * bVar261 | (bVar251 >= bVar261) * bVar251;
    bVar251 = auVar111[8];
    bVar209 = (bVar251 < bVar262) * bVar262 | (bVar251 >= bVar262) * bVar251;
    bVar251 = auVar111[9];
    bVar210 = (bVar251 < bVar263) * bVar263 | (bVar251 >= bVar263) * bVar251;
    bVar251 = auVar111[10];
    bVar211 = (bVar251 < bVar264) * bVar264 | (bVar251 >= bVar264) * bVar251;
    bVar251 = auVar111[0xb];
    bVar212 = (bVar251 < bVar265) * bVar265 | (bVar251 >= bVar265) * bVar251;
    bVar251 = auVar111[0xc];
    bVar213 = (bVar251 < bVar266) * bVar266 | (bVar251 >= bVar266) * bVar251;
    bVar251 = auVar111[0xd];
    bVar214 = (bVar251 < bVar267) * bVar267 | (bVar251 >= bVar267) * bVar251;
    bVar251 = auVar111[0xe];
    bVar255 = auVar111[0xf];
    bVar215 = (bVar251 < bVar268) * bVar268 | (bVar251 >= bVar268) * bVar251;
    bVar216 = (bVar255 < bVar269) * bVar269 | (bVar255 >= bVar269) * bVar255;
    auVar66 = psubusb(auVar297,auVar253);
    auVar252 = psubusb(auVar253,auVar297);
    auVar252 = auVar252 | auVar66;
    auVar66 = psubusb(auVar282,auVar297);
    auVar111 = psubusb(auVar297,auVar282);
    auVar111 = auVar111 | auVar66;
    bVar251 = auVar252[0];
    bVar255 = auVar111[0];
    bVar217 = (bVar255 < bVar251) * bVar251 | (bVar255 >= bVar251) * bVar255;
    bVar255 = auVar252[1];
    bVar256 = auVar111[1];
    bVar235 = (bVar256 < bVar255) * bVar255 | (bVar256 >= bVar255) * bVar256;
    bVar256 = auVar252[2];
    bVar257 = auVar111[2];
    bVar236 = (bVar257 < bVar256) * bVar256 | (bVar257 >= bVar256) * bVar257;
    bVar257 = auVar252[3];
    bVar258 = auVar111[3];
    bVar237 = (bVar258 < bVar257) * bVar257 | (bVar258 >= bVar257) * bVar258;
    bVar258 = auVar252[4];
    bVar259 = auVar111[4];
    bVar238 = (bVar259 < bVar258) * bVar258 | (bVar259 >= bVar258) * bVar259;
    bVar259 = auVar252[5];
    bVar260 = auVar111[5];
    bVar239 = (bVar260 < bVar259) * bVar259 | (bVar260 >= bVar259) * bVar260;
    bVar260 = auVar252[6];
    bVar261 = auVar111[6];
    bVar240 = (bVar261 < bVar260) * bVar260 | (bVar261 >= bVar260) * bVar261;
    bVar261 = auVar252[7];
    bVar262 = auVar111[7];
    bVar241 = (bVar262 < bVar261) * bVar261 | (bVar262 >= bVar261) * bVar262;
    bVar262 = auVar252[8];
    bVar263 = auVar111[8];
    bVar242 = (bVar263 < bVar262) * bVar262 | (bVar263 >= bVar262) * bVar263;
    bVar263 = auVar252[9];
    bVar264 = auVar111[9];
    bVar243 = (bVar264 < bVar263) * bVar263 | (bVar264 >= bVar263) * bVar264;
    bVar264 = auVar252[10];
    bVar265 = auVar111[10];
    bVar244 = (bVar265 < bVar264) * bVar264 | (bVar265 >= bVar264) * bVar265;
    bVar265 = auVar252[0xb];
    bVar266 = auVar111[0xb];
    bVar245 = (bVar266 < bVar265) * bVar265 | (bVar266 >= bVar265) * bVar266;
    bVar266 = auVar252[0xc];
    bVar267 = auVar111[0xc];
    bVar246 = (bVar267 < bVar266) * bVar266 | (bVar267 >= bVar266) * bVar267;
    bVar267 = auVar252[0xd];
    bVar268 = auVar111[0xd];
    bVar247 = (bVar268 < bVar267) * bVar267 | (bVar268 >= bVar267) * bVar268;
    bVar268 = auVar252[0xe];
    bVar269 = auVar111[0xe];
    bVar249 = auVar111[0xf];
    bVar248 = (bVar269 < bVar268) * bVar268 | (bVar269 >= bVar268) * bVar269;
    bVar269 = auVar252[0xf];
    bVar249 = (bVar249 < bVar269) * bVar269 | (bVar249 >= bVar269) * bVar249;
    bVar217 = (bVar217 < bVar270) * bVar270 | (bVar217 >= bVar270) * bVar217;
    bVar235 = (bVar235 < bVar202) * bVar202 | (bVar235 >= bVar202) * bVar235;
    bVar236 = (bVar236 < bVar203) * bVar203 | (bVar236 >= bVar203) * bVar236;
    bVar237 = (bVar237 < bVar204) * bVar204 | (bVar237 >= bVar204) * bVar237;
    bVar205 = (bVar238 < bVar205) * bVar205 | (bVar238 >= bVar205) * bVar238;
    bVar206 = (bVar239 < bVar206) * bVar206 | (bVar239 >= bVar206) * bVar239;
    bVar207 = (bVar240 < bVar207) * bVar207 | (bVar240 >= bVar207) * bVar240;
    bVar208 = (bVar241 < bVar208) * bVar208 | (bVar241 >= bVar208) * bVar241;
    bVar209 = (bVar242 < bVar209) * bVar209 | (bVar242 >= bVar209) * bVar242;
    bVar210 = (bVar243 < bVar210) * bVar210 | (bVar243 >= bVar210) * bVar243;
    bVar211 = (bVar244 < bVar211) * bVar211 | (bVar244 >= bVar211) * bVar244;
    bVar212 = (bVar245 < bVar212) * bVar212 | (bVar245 >= bVar212) * bVar245;
    bVar213 = (bVar246 < bVar213) * bVar213 | (bVar246 >= bVar213) * bVar246;
    bVar214 = (bVar247 < bVar214) * bVar214 | (bVar247 >= bVar214) * bVar247;
    bVar215 = (bVar248 < bVar215) * bVar215 | (bVar248 >= bVar215) * bVar248;
    bVar216 = (bVar249 < bVar216) * bVar216 | (bVar249 >= bVar216) * bVar249;
    bVar270 = auVar57[0];
    bVar202 = auVar57[1];
    bVar203 = auVar57[2];
    bVar204 = auVar57[3];
    auVar164[0] = -((byte)((bVar270 < bVar217) * bVar270 | (bVar270 >= bVar217) * bVar217) ==
                   bVar217);
    auVar164[1] = -((byte)((bVar202 < bVar235) * bVar202 | (bVar202 >= bVar235) * bVar235) ==
                   bVar235);
    auVar164[2] = -((byte)((bVar203 < bVar236) * bVar203 | (bVar203 >= bVar236) * bVar236) ==
                   bVar236);
    auVar164[3] = -((byte)((bVar204 < bVar237) * bVar204 | (bVar204 >= bVar237) * bVar237) ==
                   bVar237);
    auVar164[4] = -((byte)((bVar270 < bVar205) * bVar270 | (bVar270 >= bVar205) * bVar205) ==
                   bVar205);
    auVar164[5] = -((byte)((bVar202 < bVar206) * bVar202 | (bVar202 >= bVar206) * bVar206) ==
                   bVar206);
    auVar164[6] = -((byte)((bVar203 < bVar207) * bVar203 | (bVar203 >= bVar207) * bVar207) ==
                   bVar207);
    auVar164[7] = -((byte)((bVar204 < bVar208) * bVar204 | (bVar204 >= bVar208) * bVar208) ==
                   bVar208);
    auVar164[8] = -((byte)((bVar270 < bVar209) * bVar270 | (bVar270 >= bVar209) * bVar209) ==
                   bVar209);
    auVar164[9] = -((byte)((bVar202 < bVar210) * bVar202 | (bVar202 >= bVar210) * bVar210) ==
                   bVar210);
    auVar164[10] = -((byte)((bVar203 < bVar211) * bVar203 | (bVar203 >= bVar211) * bVar211) ==
                    bVar211);
    auVar164[0xb] =
         -((byte)((bVar204 < bVar212) * bVar204 | (bVar204 >= bVar212) * bVar212) == bVar212);
    auVar164[0xc] =
         -((byte)((bVar270 < bVar213) * bVar270 | (bVar270 >= bVar213) * bVar213) == bVar213);
    auVar164[0xd] =
         -((byte)((bVar202 < bVar214) * bVar202 | (bVar202 >= bVar214) * bVar214) == bVar214);
    auVar164[0xe] =
         -((byte)((bVar203 < bVar215) * bVar203 | (bVar203 >= bVar215) * bVar215) == bVar215);
    auVar164[0xf] =
         -((byte)((bVar204 < bVar216) * bVar204 | (bVar204 >= bVar216) * bVar216) == bVar216);
    auVar66 = psubusb(auVar297,auVar281);
    auVar252 = psubusb(auVar281,auVar297);
    auVar252 = auVar252 | auVar66;
    auVar66 = psubusb(auVar253,auVar122);
    auVar111 = psubusb(auVar122,auVar253);
    auVar250._0_2_ = auVar252._0_2_ >> 1;
    auVar250._2_2_ = auVar252._2_2_ >> 1;
    auVar250._4_2_ = auVar252._4_2_ >> 1;
    auVar250._6_2_ = auVar252._6_2_ >> 1;
    auVar250._8_2_ = auVar252._8_2_ >> 1;
    auVar250._10_2_ = auVar252._10_2_ >> 1;
    auVar250._12_2_ = auVar252._12_2_ >> 1;
    auVar250._14_2_ = auVar252._14_2_ >> 1;
    auVar66 = paddusb(auVar111 | auVar66,auVar111 | auVar66);
    auVar252 = paddusb(auVar66,auVar250 & _DAT_001b8730);
    bVar270 = auVar97[0];
    bVar205 = auVar252[0];
    bVar202 = auVar97[1];
    bVar206 = auVar252[1];
    bVar203 = auVar97[2];
    bVar207 = auVar252[2];
    bVar204 = auVar97[3];
    bVar208 = auVar252[3];
    bVar209 = auVar252[4];
    bVar210 = auVar252[5];
    bVar211 = auVar252[6];
    bVar212 = auVar252[7];
    bVar213 = auVar252[8];
    bVar214 = auVar252[9];
    bVar215 = auVar252[10];
    bVar216 = auVar252[0xb];
    bVar217 = auVar252[0xc];
    bVar235 = auVar252[0xd];
    bVar236 = auVar252[0xe];
    bVar237 = auVar252[0xf];
    auVar272[0] = -((byte)((bVar270 < bVar205) * bVar270 | (bVar270 >= bVar205) * bVar205) ==
                   bVar205);
    auVar272[1] = -((byte)((bVar202 < bVar206) * bVar202 | (bVar202 >= bVar206) * bVar206) ==
                   bVar206);
    auVar272[2] = -((byte)((bVar203 < bVar207) * bVar203 | (bVar203 >= bVar207) * bVar207) ==
                   bVar207);
    auVar272[3] = -((byte)((bVar204 < bVar208) * bVar204 | (bVar204 >= bVar208) * bVar208) ==
                   bVar208);
    auVar272[4] = -((byte)((bVar270 < bVar209) * bVar270 | (bVar270 >= bVar209) * bVar209) ==
                   bVar209);
    auVar272[5] = -((byte)((bVar202 < bVar210) * bVar202 | (bVar202 >= bVar210) * bVar210) ==
                   bVar210);
    auVar272[6] = -((byte)((bVar203 < bVar211) * bVar203 | (bVar203 >= bVar211) * bVar211) ==
                   bVar211);
    auVar272[7] = -((byte)((bVar204 < bVar212) * bVar204 | (bVar204 >= bVar212) * bVar212) ==
                   bVar212);
    auVar272[8] = -((byte)((bVar270 < bVar213) * bVar270 | (bVar270 >= bVar213) * bVar213) ==
                   bVar213);
    auVar272[9] = -((byte)((bVar202 < bVar214) * bVar202 | (bVar202 >= bVar214) * bVar214) ==
                   bVar214);
    auVar272[10] = -((byte)((bVar203 < bVar215) * bVar203 | (bVar203 >= bVar215) * bVar215) ==
                    bVar215);
    auVar272[0xb] =
         -((byte)((bVar204 < bVar216) * bVar204 | (bVar204 >= bVar216) * bVar216) == bVar216);
    auVar272[0xc] =
         -((byte)((bVar270 < bVar217) * bVar270 | (bVar270 >= bVar217) * bVar217) == bVar217);
    auVar272[0xd] =
         -((byte)((bVar202 < bVar235) * bVar202 | (bVar202 >= bVar235) * bVar235) == bVar235);
    auVar272[0xe] =
         -((byte)((bVar203 < bVar236) * bVar203 | (bVar203 >= bVar236) * bVar236) == bVar236);
    auVar272[0xf] =
         -((byte)((bVar204 < bVar237) * bVar204 | (bVar204 >= bVar237) * bVar237) == bVar237);
    bVar270 = (bVar251 < bVar8) * bVar8 | (bVar251 >= bVar8) * bVar251;
    bVar202 = (bVar255 < bVar9) * bVar9 | (bVar255 >= bVar9) * bVar255;
    bVar274 = (bVar256 < bVar274) * bVar274 | (bVar256 >= bVar274) * bVar256;
    bVar256 = (bVar257 < bVar275) * bVar275 | (bVar257 >= bVar275) * bVar257;
    bVar275 = (bVar258 < bVar276) * bVar276 | (bVar258 >= bVar276) * bVar258;
    bVar257 = (bVar259 < bVar277) * bVar277 | (bVar259 >= bVar277) * bVar259;
    bVar276 = (bVar260 < bVar278) * bVar278 | (bVar260 >= bVar278) * bVar260;
    bVar258 = (bVar261 < bVar279) * bVar279 | (bVar261 >= bVar279) * bVar261;
    bVar277 = (bVar262 < bVar280) * bVar280 | (bVar262 >= bVar280) * bVar262;
    bVar259 = (bVar263 < bVar10) * bVar10 | (bVar263 >= bVar10) * bVar263;
    bVar278 = (bVar264 < bVar11) * bVar11 | (bVar264 >= bVar11) * bVar264;
    bVar260 = (bVar265 < bVar12) * bVar12 | (bVar265 >= bVar12) * bVar265;
    bVar279 = (bVar266 < bVar13) * bVar13 | (bVar266 >= bVar13) * bVar266;
    bVar261 = (bVar267 < bVar14) * bVar14 | (bVar267 >= bVar14) * bVar267;
    bVar280 = (bVar268 < bVar15) * bVar15 | (bVar268 >= bVar15) * bVar268;
    bVar262 = (bVar269 < bVar16) * bVar16 | (bVar269 >= bVar16) * bVar269;
    bVar8 = auVar104[0];
    bVar251 = auVar104[1];
    bVar9 = auVar104[2];
    bVar255 = auVar104[3];
    auVar194[0] = -((byte)((bVar8 < bVar270) * bVar8 | (bVar8 >= bVar270) * bVar270) == bVar270);
    auVar194[1] = -((byte)((bVar251 < bVar202) * bVar251 | (bVar251 >= bVar202) * bVar202) ==
                   bVar202);
    auVar194[2] = -((byte)((bVar9 < bVar274) * bVar9 | (bVar9 >= bVar274) * bVar274) == bVar274);
    auVar194[3] = -((byte)((bVar255 < bVar256) * bVar255 | (bVar255 >= bVar256) * bVar256) ==
                   bVar256);
    auVar194[4] = -((byte)((bVar8 < bVar275) * bVar8 | (bVar8 >= bVar275) * bVar275) == bVar275);
    auVar194[5] = -((byte)((bVar251 < bVar257) * bVar251 | (bVar251 >= bVar257) * bVar257) ==
                   bVar257);
    auVar194[6] = -((byte)((bVar9 < bVar276) * bVar9 | (bVar9 >= bVar276) * bVar276) == bVar276);
    auVar194[7] = -((byte)((bVar255 < bVar258) * bVar255 | (bVar255 >= bVar258) * bVar258) ==
                   bVar258);
    auVar194[8] = -((byte)((bVar8 < bVar277) * bVar8 | (bVar8 >= bVar277) * bVar277) == bVar277);
    auVar194[9] = -((byte)((bVar251 < bVar259) * bVar251 | (bVar251 >= bVar259) * bVar259) ==
                   bVar259);
    auVar194[10] = -((byte)((bVar9 < bVar278) * bVar9 | (bVar9 >= bVar278) * bVar278) == bVar278);
    auVar194[0xb] =
         -((byte)((bVar255 < bVar260) * bVar255 | (bVar255 >= bVar260) * bVar260) == bVar260);
    auVar194[0xc] = -((byte)((bVar8 < bVar279) * bVar8 | (bVar8 >= bVar279) * bVar279) == bVar279);
    auVar194[0xd] =
         -((byte)((bVar251 < bVar261) * bVar251 | (bVar251 >= bVar261) * bVar261) == bVar261);
    auVar194[0xe] = -((byte)((bVar9 < bVar280) * bVar9 | (bVar9 >= bVar280) * bVar280) == bVar280);
    auVar194[0xf] =
         -((byte)((bVar255 < bVar262) * bVar255 | (bVar255 >= bVar262) * bVar262) == bVar262);
    auVar66 = psubsb(auVar281 ^ auVar40,auVar297 ^ auVar40);
    auVar111 = psubsb(auVar253 ^ auVar40,auVar122 ^ auVar40);
    auVar66 = paddsb(~auVar194 & auVar66,auVar111);
    auVar66 = paddsb(auVar66,auVar111);
    auVar66 = paddsb(auVar66,auVar111);
    puVar43 = p + 2;
    p = p + 4;
    auVar272 = auVar66 & auVar164 & auVar272;
    auVar66 = paddsb(auVar272,_DAT_001b8740);
    auVar273 = paddsb(auVar272,_DAT_001b8750);
    auVar230._0_14_ = auVar252._0_14_;
    auVar230[0xe] = bVar212;
    auVar230[0xf] = auVar66[7];
    auVar229._14_2_ = auVar230._14_2_;
    auVar229._0_13_ = auVar252._0_13_;
    auVar229[0xd] = auVar66[6];
    auVar228._13_3_ = auVar229._13_3_;
    auVar228._0_12_ = auVar252._0_12_;
    auVar228[0xc] = bVar211;
    auVar227._12_4_ = auVar228._12_4_;
    auVar227._0_11_ = auVar252._0_11_;
    auVar227[0xb] = auVar66[5];
    auVar226._11_5_ = auVar227._11_5_;
    auVar226._0_10_ = auVar252._0_10_;
    auVar226[10] = bVar210;
    auVar225._10_6_ = auVar226._10_6_;
    auVar225._0_9_ = auVar252._0_9_;
    auVar225[9] = auVar66[4];
    auVar224._9_7_ = auVar225._9_7_;
    auVar224._0_8_ = auVar252._0_8_;
    auVar224[8] = bVar209;
    auVar223._8_8_ = auVar224._8_8_;
    auVar223[7] = auVar66[3];
    auVar223[6] = bVar208;
    auVar223[5] = auVar66[2];
    auVar223[4] = bVar207;
    auVar223[3] = auVar66[1];
    auVar223[2] = bVar206;
    auVar223[1] = auVar66[0];
    auVar223[0] = bVar205;
    auVar112[1] = auVar66[8];
    auVar112[0] = auVar66[8];
    auVar112[2] = auVar66[9];
    auVar112[3] = auVar66[9];
    auVar112[4] = auVar66[10];
    auVar112[5] = auVar66[10];
    auVar112[6] = auVar66[0xb];
    auVar112[7] = auVar66[0xb];
    auVar112[8] = auVar66[0xc];
    auVar112[9] = auVar66[0xc];
    auVar112[10] = auVar66[0xd];
    auVar112[0xb] = auVar66[0xd];
    auVar112[0xc] = auVar66[0xe];
    auVar112[0xd] = auVar66[0xe];
    auVar112[0xf] = auVar66[0xf];
    auVar112[0xe] = auVar112[0xf];
    auVar111 = psraw(auVar223,0xb);
    auVar66 = psraw(auVar112,0xb);
    auVar252 = packsswb(auVar111,auVar66);
    auVar120._0_14_ = auVar66._0_14_;
    auVar120[0xe] = auVar66[7];
    auVar120[0xf] = auVar273[7];
    auVar119._14_2_ = auVar120._14_2_;
    auVar119._0_13_ = auVar66._0_13_;
    auVar119[0xd] = auVar273[6];
    auVar118._13_3_ = auVar119._13_3_;
    auVar118._0_12_ = auVar66._0_12_;
    auVar118[0xc] = auVar66[6];
    auVar117._12_4_ = auVar118._12_4_;
    auVar117._0_11_ = auVar66._0_11_;
    auVar117[0xb] = auVar273[5];
    auVar116._11_5_ = auVar117._11_5_;
    auVar116._0_10_ = auVar66._0_10_;
    auVar116[10] = auVar66[5];
    auVar115._10_6_ = auVar116._10_6_;
    auVar115._0_9_ = auVar66._0_9_;
    auVar115[9] = auVar273[4];
    auVar114._9_7_ = auVar115._9_7_;
    auVar114._0_8_ = auVar66._0_8_;
    auVar114[8] = auVar66[4];
    auVar113._8_8_ = auVar114._8_8_;
    auVar113[7] = auVar273[3];
    auVar113[6] = auVar66[3];
    auVar113[5] = auVar273[2];
    auVar113[4] = auVar66[2];
    auVar113[3] = auVar273[1];
    auVar113[2] = auVar66[1];
    auVar113[0] = auVar66[0];
    auVar113[1] = auVar273[0];
    auVar165[1] = auVar273[8];
    auVar165[0] = auVar164[8];
    auVar165[2] = auVar164[9];
    auVar165[3] = auVar273[9];
    auVar165[4] = auVar164[10];
    auVar165[5] = auVar273[10];
    auVar165[6] = auVar164[0xb];
    auVar165[7] = auVar273[0xb];
    auVar165[8] = auVar164[0xc];
    auVar165[9] = auVar273[0xc];
    auVar165[10] = auVar164[0xd];
    auVar165[0xb] = auVar273[0xd];
    auVar165[0xc] = auVar164[0xe];
    auVar165[0xd] = auVar273[0xe];
    auVar165[0xe] = auVar164[0xf];
    auVar165[0xf] = auVar273[0xf];
    auVar66 = psraw(auVar113,0xb);
    auVar111 = psraw(auVar165,0xb);
    auVar66 = packsswb(auVar66,auVar111);
    auVar111 = paddsb(auVar252,auVar122 ^ auVar40);
    auVar254 = psubsb(auVar253 ^ auVar40,auVar66);
    auVar254 = auVar254 ^ auVar40;
    auVar66 = auVar66 ^ auVar40;
    cVar105 = pavgb(auVar66[0],0);
    cVar124 = pavgb(auVar66[1],0);
    cVar125 = pavgb(auVar66[2],0);
    cVar126 = pavgb(auVar66[3],0);
    cVar127 = pavgb(auVar66[4],0);
    cVar129 = pavgb(auVar66[5],0);
    cVar130 = pavgb(auVar66[6],0);
    cVar132 = pavgb(auVar66[7],0);
    cVar133 = pavgb(auVar66[8],0);
    cVar135 = pavgb(auVar66[9],0);
    cVar136 = pavgb(auVar66[10],0);
    cVar138 = pavgb(auVar66[0xb],0);
    cVar139 = pavgb(auVar66[0xc],0);
    cVar141 = pavgb(auVar66[0xd],0);
    cVar142 = pavgb(auVar66[0xe],0);
    cVar144 = pavgb(auVar66[0xf],0);
    auVar121[0] = cVar105 + -0x40;
    auVar121[1] = cVar124 + -0x40;
    auVar121[2] = cVar125 + -0x40;
    auVar121[3] = cVar126 + -0x40;
    auVar121[4] = cVar127 + -0x40;
    auVar121[5] = cVar129 + -0x40;
    auVar121[6] = cVar130 + -0x40;
    auVar121[7] = cVar132 + -0x40;
    auVar121[8] = cVar133 + -0x40;
    auVar121[9] = cVar135 + -0x40;
    auVar121[10] = cVar136 + -0x40;
    auVar121[0xb] = cVar138 + -0x40;
    auVar121[0xc] = cVar139 + -0x40;
    auVar121[0xd] = cVar141 + -0x40;
    auVar121[0xe] = cVar142 + -0x40;
    auVar121[0xf] = cVar144 + -0x40;
    auVar298 = psubsb(auVar297 ^ auVar40,auVar121 & auVar194);
    auVar122 = paddsb(auVar121 & auVar194,auVar281 ^ auVar40);
    auVar298 = auVar298 ^ auVar40;
    auVar111 = auVar111 ^ auVar40;
    auVar122 = auVar122 ^ auVar40;
    auVar173._0_14_ = auVar122._0_14_;
    auVar173[0xe] = auVar122[7];
    auVar173[0xf] = auVar111[7];
    auVar172._14_2_ = auVar173._14_2_;
    auVar172._0_13_ = auVar122._0_13_;
    auVar172[0xd] = auVar111[6];
    auVar171._13_3_ = auVar172._13_3_;
    auVar171._0_12_ = auVar122._0_12_;
    auVar171[0xc] = auVar122[6];
    auVar170._12_4_ = auVar171._12_4_;
    auVar170._0_11_ = auVar122._0_11_;
    auVar170[0xb] = auVar111[5];
    auVar169._11_5_ = auVar170._11_5_;
    auVar169._0_10_ = auVar122._0_10_;
    auVar169[10] = auVar122[5];
    auVar168._10_6_ = auVar169._10_6_;
    auVar168._0_9_ = auVar122._0_9_;
    auVar168[9] = auVar111[4];
    auVar167._9_7_ = auVar168._9_7_;
    auVar167._0_8_ = auVar122._0_8_;
    auVar167[8] = auVar122[4];
    Var22 = CONCAT91(CONCAT81(auVar167._8_8_,auVar111[3]),auVar122[3]);
    auVar36._2_10_ = Var22;
    auVar36[1] = auVar111[2];
    auVar36[0] = auVar122[2];
    auVar35._2_12_ = auVar36;
    auVar35[1] = auVar111[1];
    auVar35[0] = auVar122[1];
    auVar166._0_2_ = CONCAT11(auVar111[0],auVar122[0]);
    auVar166._2_14_ = auVar35;
    uVar106 = CONCAT11(auVar111[8],auVar122[8]);
    uVar73 = CONCAT13(auVar111[9],CONCAT12(auVar122[9],uVar106));
    uVar107 = CONCAT15(auVar111[10],CONCAT14(auVar122[10],uVar73));
    uVar108 = CONCAT17(auVar111[0xb],CONCAT16(auVar122[0xb],uVar107));
    auVar109._0_10_ = CONCAT19(auVar111[0xc],CONCAT18(auVar122[0xc],uVar108));
    auVar109[10] = auVar122[0xd];
    auVar109[0xb] = auVar111[0xd];
    auVar110[0xc] = auVar122[0xe];
    auVar110._0_12_ = auVar109;
    auVar110[0xd] = auVar111[0xe];
    auVar123[0xe] = auVar122[0xf];
    auVar123._0_14_ = auVar110;
    auVar123[0xf] = auVar111[0xf];
    auVar201._0_14_ = auVar254._0_14_;
    auVar201[0xe] = auVar254[7];
    auVar201[0xf] = auVar298[7];
    auVar200._14_2_ = auVar201._14_2_;
    auVar200._0_13_ = auVar254._0_13_;
    auVar200[0xd] = auVar298[6];
    auVar199._13_3_ = auVar200._13_3_;
    auVar199._0_12_ = auVar254._0_12_;
    auVar199[0xc] = auVar254[6];
    auVar198._12_4_ = auVar199._12_4_;
    auVar198._0_11_ = auVar254._0_11_;
    auVar198[0xb] = auVar298[5];
    auVar197._11_5_ = auVar198._11_5_;
    auVar197._0_10_ = auVar254._0_10_;
    auVar197[10] = auVar254[5];
    auVar196._10_6_ = auVar197._10_6_;
    auVar196._0_9_ = auVar254._0_9_;
    auVar196[9] = auVar298[4];
    auVar195._9_7_ = auVar196._9_7_;
    auVar195._0_8_ = auVar254._0_8_;
    auVar195[8] = auVar254[4];
    Var24 = CONCAT91(CONCAT81(auVar195._8_8_,auVar298[3]),auVar254[3]);
    auVar38._2_10_ = Var24;
    auVar38[1] = auVar298[2];
    auVar38[0] = auVar254[2];
    auVar37._2_12_ = auVar38;
    auVar37[1] = auVar298[1];
    auVar37[0] = auVar254[1];
    auVar234[3] = auVar298[0];
    auVar234[2] = auVar254[0];
    uVar283 = CONCAT11(auVar298[8],auVar254[8]);
    uVar284 = CONCAT13(auVar298[9],CONCAT12(auVar254[9],uVar283));
    uVar285 = CONCAT15(auVar298[10],CONCAT14(auVar254[10],uVar284));
    uVar286 = CONCAT17(auVar298[0xb],CONCAT16(auVar254[0xb],uVar285));
    auVar287._0_10_ = CONCAT19(auVar298[0xc],CONCAT18(auVar254[0xc],uVar286));
    auVar287[10] = auVar254[0xd];
    auVar287[0xb] = auVar298[0xd];
    auVar288[0xc] = auVar254[0xe];
    auVar288._0_12_ = auVar287;
    auVar288[0xd] = auVar298[0xe];
    auVar289[0xe] = auVar254[0xf];
    auVar289._0_14_ = auVar288;
    auVar289[0xf] = auVar298[0xf];
    auVar233._0_12_ = auVar166._0_12_;
    auVar233._12_2_ = (short)Var22;
    auVar233._14_2_ = (short)Var24;
    auVar232._12_4_ = auVar233._12_4_;
    auVar232._0_10_ = auVar166._0_10_;
    auVar232._10_2_ = auVar38._0_2_;
    auVar231._10_6_ = auVar232._10_6_;
    auVar231._0_8_ = auVar166._0_8_;
    auVar231._8_2_ = auVar36._0_2_;
    auVar234._8_8_ = auVar231._8_8_;
    auVar234._6_2_ = auVar37._0_2_;
    auVar234._4_2_ = auVar35._0_2_;
    auVar234._0_2_ = auVar166._0_2_;
    auVar294._12_2_ = (short)((ulong)uVar108 >> 0x30);
    auVar294._0_12_ = auVar109;
    auVar294._14_2_ = (short)((ulong)uVar286 >> 0x30);
    auVar293._12_4_ = auVar294._12_4_;
    auVar293._10_2_ = (short)((uint6)uVar285 >> 0x20);
    auVar293._0_10_ = auVar109._0_10_;
    auVar292._10_6_ = auVar293._10_6_;
    auVar292._8_2_ = (short)((uint6)uVar107 >> 0x20);
    auVar292._0_8_ = uVar108;
    auVar291._8_8_ = auVar292._8_8_;
    auVar291._6_2_ = (short)((uint)uVar284 >> 0x10);
    auVar291._0_6_ = uVar107;
    auVar290._6_10_ = auVar291._6_10_;
    auVar290._4_2_ = (short)((uint)uVar73 >> 0x10);
    auVar290._0_4_ = uVar73;
    auVar295._4_12_ = auVar290._4_12_;
    auVar295._2_2_ = uVar283;
    auVar295._0_2_ = uVar106;
    iVar44 = 4;
    puVar45 = puVar43;
    do {
      *(int *)puVar45 = auVar234._0_4_;
      auVar234 = auVar234 >> 0x20;
      puVar45 = puVar45 + lVar41;
      iVar44 = iVar44 + -1;
    } while (iVar44 != 0);
    puVar45 = puVar43 + lVar2;
    iVar44 = 4;
    uVar106 = auVar167._8_2_;
    uVar283 = auVar195._8_2_;
    uVar128 = auVar169._10_2_;
    uVar131 = auVar197._10_2_;
    uVar134 = auVar171._12_2_;
    uVar137 = auVar199._12_2_;
    uVar140 = auVar172._14_2_;
    uVar143 = auVar200._14_2_;
    do {
      *(undefined2 *)puVar45 = uVar106;
      *(undefined2 *)(puVar45 + 2) = uVar283;
      puVar45 = puVar45 + lVar41;
      iVar44 = iVar44 + -1;
      uVar106 = uVar128;
      uVar283 = uVar131;
      uVar128 = uVar134;
      uVar131 = uVar137;
      uVar134 = uVar140;
      uVar137 = uVar143;
      uVar140 = 0;
      uVar143 = 0;
    } while (iVar44 != 0);
    iVar44 = 4;
    puVar45 = puVar43 + lVar1;
    do {
      *(int *)puVar45 = auVar295._0_4_;
      auVar295 = auVar295 >> 0x20;
      puVar45 = puVar45 + lVar41;
      iVar44 = iVar44 + -1;
    } while (iVar44 != 0);
    puVar43 = puVar43 + lVar1 + lVar2;
    iVar44 = 4;
    uVar106 = (short)((unkuint10)auVar109._0_10_ >> 0x40);
    uVar283 = (short)((unkuint10)auVar287._0_10_ >> 0x40);
    uVar128 = auVar109._10_2_;
    uVar131 = auVar287._10_2_;
    uVar134 = auVar110._12_2_;
    uVar137 = auVar288._12_2_;
    uVar140 = auVar123._14_2_;
    uVar143 = auVar289._14_2_;
    do {
      *(undefined2 *)puVar43 = uVar106;
      *(undefined2 *)(puVar43 + 2) = uVar283;
      puVar43 = puVar43 + lVar41;
      iVar44 = iVar44 + -1;
      uVar106 = uVar128;
      uVar283 = uVar131;
      uVar128 = uVar134;
      uVar131 = uVar137;
      uVar134 = uVar140;
      uVar137 = uVar143;
      uVar140 = 0;
      uVar143 = 0;
    } while (iVar44 != 0);
    bVar7 = 1 < uVar42;
    auVar122 = auVar72;
    auVar281 = auVar282;
    uVar42 = uVar42 - 1;
  } while (bVar7);
  return;
}

Assistant:

static void HFilter16i_SSE2(uint8_t* p, int stride,
                            int thresh, int ithresh, int hev_thresh) {
  int k;
  __m128i p3, p2, p1, p0;   // loop invariants

  Load16x4_SSE2(p, p + 8 * stride, stride, &p3, &p2, &p1, &p0);  // prologue

  for (k = 3; k > 0; --k) {
    __m128i mask, tmp1, tmp2;
    uint8_t* const b = p + 2;   // beginning of p1

    p += 4;  // beginning of q0 (and next span)

    MAX_DIFF1(p3, p2, p1, p0, mask);   // compute partial mask
    Load16x4_SSE2(p, p + 8 * stride, stride, &p3, &p2, &tmp1, &tmp2);
    MAX_DIFF2(p3, p2, tmp1, tmp2, mask);

    ComplexMask_SSE2(&p1, &p0, &p3, &p2, thresh, ithresh, &mask);
    DoFilter4_SSE2(&p1, &p0, &p3, &p2, &mask, hev_thresh);

    Store16x4_SSE2(&p1, &p0, &p3, &p2, b, b + 8 * stride, stride);

    // rotate samples
    p1 = tmp1;
    p0 = tmp2;
  }
}